

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O2

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  ushort uVar3;
  Pos PVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uchar *puVar14;
  short sVar15;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong local_50;
  ulong local_48;
  ulong uVar16;
  
  iVar2 = s->level;
  uVar20 = 0;
  local_50 = 0;
  uVar9 = 0;
  local_48 = 0;
  do {
    if (s->lookahead < 0x106) {
      zng_fill_window(s);
      uVar19 = s->lookahead;
      if (flush == 0 && uVar19 < 0x106) {
        return need_more;
      }
      uVar7 = s->strstart;
      if (uVar19 == 0) {
        uVar19 = 2;
        if (uVar7 < 2) {
          uVar19 = uVar7;
        }
        s->insert = uVar19;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar14 = (uchar *)0x0;
          }
          else {
            puVar14 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar14,uVar7 - iVar2,1);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar14 = (uchar *)0x0;
          }
          else {
            puVar14 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar14,uVar7 - iVar2,0);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (uVar19 < 4) {
        uVar3 = 0;
      }
      else {
LAB_00105a1a:
        uVar3 = quick_insert_string(s,uVar7);
        uVar7 = s->strstart;
      }
      uVar9 = 1;
      uVar6 = 0;
      if (((uVar3 != 0) && (0 < (long)((ulong)uVar7 - (ulong)uVar3))) &&
         (uVar6 = 0, (long)((ulong)uVar7 - (ulong)uVar3) <= (long)(ulong)(s->w_size - 0x106))) {
        uVar5 = (*functable.longest_match)(s,uVar3);
        if ((uVar5 & 0xfffc) == 0) {
          uVar5 = 1;
        }
        uVar3 = (ushort)s->match_start;
        uVar19 = (uint)uVar3;
        uVar6 = (uint)uVar3;
        if (uVar3 < (ushort)uVar7) {
          uVar17 = (ulong)uVar7;
          uVar9 = uVar5;
          goto LAB_00105a7e;
        }
      }
      uVar19 = uVar6;
      uVar17 = (ulong)uVar7;
    }
    else {
      if (iVar2 < 5) {
LAB_00105a13:
        uVar7 = s->strstart;
        goto LAB_00105a1a;
      }
      uVar7 = (uint)uVar20;
      uVar19 = (uint)local_48;
      uVar17 = local_50;
      if ((short)uVar9 == 0) goto LAB_00105a13;
    }
LAB_00105a7e:
    uVar3 = (ushort)uVar9;
    uVar16 = (ulong)uVar3;
    if ((uVar9 & 0xffff) + 4 < s->lookahead) {
      uVar6 = (uint)uVar17 + 1;
      uVar8 = (uVar9 & 0xffff) - 1;
      uVar5 = uVar8 & 0xffff;
      uVar13 = uVar6 & 0xffff;
      if ((uVar8 & 0xffff) < 3) {
        if (((uVar8 & 0xffff) == 0) || ((ushort)uVar6 < (ushort)uVar7)) goto LAB_00105ab0;
      }
      else if ((ushort)uVar6 < (ushort)uVar7) {
        uVar13 = uVar7 & 0xffff;
        uVar7 = (uVar8 & 0xffff) + (uVar6 & 0xffff);
        uVar5 = uVar7 - uVar13;
        if (uVar7 < uVar13 || uVar5 == 0) goto LAB_00105ab0;
      }
      insert_string(s,uVar13,uVar5);
    }
LAB_00105ab0:
    uVar7 = (uint)uVar17 & 0xffff;
    if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
       (uVar5 = (uVar9 & 0xffff) + uVar7, s->window_size - 0x106 <= uVar5)) {
      uVar16 = (ulong)uVar9;
      uVar9 = 0;
    }
    else {
      s->strstart = uVar5;
      PVar4 = quick_insert_string(s,uVar5);
      uVar6 = s->strstart;
      uVar20 = (ulong)uVar6;
      local_50 = uVar20;
      if (((PVar4 == 0) || ((long)(uVar20 - PVar4) < 1)) ||
         ((long)(ulong)(s->w_size - 0x106) < (long)(uVar20 - PVar4))) {
        local_48 = 0;
        uVar5 = 1;
      }
      else {
        uVar5 = (*functable.longest_match)(s,PVar4);
        local_48 = (ulong)s->match_start;
        uVar10 = local_48 & 0xffff;
        uVar11 = uVar20 & 0xffff;
        if (((uint)uVar10 < (uint)uVar11) && (3 < (ushort)uVar5)) {
          if (((1 < uVar3) && ((uVar9 & 0xffff) <= (uint)uVar10 + 1)) &&
             (puVar14 = s->window, puVar14[(uVar10 + 1) - uVar16] == puVar14[(uVar11 + 1) - uVar16])
             ) {
            uVar13 = s->w_size - 0x106;
            uVar8 = uVar6 - uVar13 & 0xffff;
            if ((uint)uVar11 <= uVar13) {
              uVar8 = 0;
            }
            lVar12 = 0;
            uVar9 = uVar5;
            while( true ) {
              sVar15 = (short)lVar12;
              if ((((puVar14[lVar12 + (uVar10 - 1)] != puVar14[lVar12 + (uVar11 - 1)]) ||
                   ((ushort)(uVar3 + sVar15) == 0)) || ((uVar6 + (int)lVar12 & 0xffff) <= uVar8)) ||
                 ((0xff < (ushort)uVar9 || ((ushort)((short)s->match_start + sVar15) < 2)))) break;
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 + -1;
            }
            if (((int)lVar12 != 0) &&
               (((ushort)(uVar16 + lVar12) < 2 && ((ushort)((ushort)uVar5 - 2) != sVar15)))) {
              local_50 = uVar20 + lVar12;
              local_48 = local_48 + lVar12;
              uVar20 = (ulong)(uVar6 + 1);
              uVar16 = uVar16 + lVar12 & 0xffffffff;
              uVar5 = uVar9;
            }
          }
        }
        else {
          uVar5 = 1;
        }
      }
      uVar9 = uVar5;
      s->strstart = uVar7;
    }
    uVar6 = (uint)uVar16 & 0xffff;
    if ((ushort)uVar16 < 4) {
      uVar7 = 0;
      while (sVar15 = (short)uVar16, uVar16 = (ulong)(ushort)(sVar15 - 1), sVar15 != 0) {
        bVar1 = s->window[uVar17 & 0xffff];
        uVar19 = s->sym_next;
        s->d_buf[uVar19] = 0;
        s->sym_next = uVar19 + 1;
        s->l_buf[uVar19] = bVar1;
        s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
        uVar7 = uVar7 + (s->sym_next == s->sym_end);
        s->lookahead = s->lookahead - 1;
        uVar17 = (ulong)((int)uVar17 + 1);
      }
    }
    else {
      iVar18 = uVar7 - (uVar19 & 0xffff);
      uVar7 = s->sym_next;
      s->d_buf[uVar7] = (uint16_t)iVar18;
      s->sym_next = uVar7 + 1;
      s->l_buf[uVar7] = (uchar)(uVar6 - 3);
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar6 - 3] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar6 - 3] + 0x101].fc.freq + 1;
      uVar19 = iVar18 - 1;
      uVar7 = (uVar19 >> 7) + 0x100;
      if (uVar19 < 0x100) {
        uVar7 = uVar19;
      }
      s->dyn_dtree[""[uVar7]].fc.freq = s->dyn_dtree[""[uVar7]].fc.freq + 1;
      uVar7 = (uint)(s->sym_next == s->sym_end);
      s->lookahead = s->lookahead - uVar6;
    }
    uVar6 = uVar6 + s->strstart;
    s->strstart = uVar6;
    if (uVar7 != 0) {
      iVar18 = s->block_start;
      if ((long)iVar18 < 0) {
        puVar14 = (uchar *)0x0;
      }
      else {
        puVar14 = s->window + iVar18;
      }
      zng_tr_flush_block(s,(char *)puVar14,uVar6 - iVar18,0);
      s->block_start = s->strstart;
      zng_flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}